

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O2

bool __thiscall
cmProcessOutput::DecodeText
          (cmProcessOutput *this,char *data,size_t length,string *decoded,size_t id)

{
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,data,data + length);
  std::__cxx11::string::swap((string *)decoded);
  std::__cxx11::string::~string((string *)local_30);
  return true;
}

Assistant:

bool cmProcessOutput::DecodeText(const char* data, size_t length,
                                 std::string& decoded, size_t id)
{
  return DecodeText(std::string(data, length), decoded, id);
}